

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O2

int bsumMain(int argc,char **argv)

{
  bool bVar1;
  FILE *__stream;
  bool bVar2;
  octet oVar3;
  bool_t bVar4;
  int iVar5;
  u32 uVar6;
  int iVar7;
  char *pcVar8;
  file_t file;
  char *pcVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  char **ppcVar14;
  ulong hid;
  long lVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong local_4b0;
  long local_498;
  long local_490;
  octet hash [64];
  char local_438 [1032];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  bsum [hash_alg] <file_to_hash> <file_to_hash> ...\n  bsum [hash_alg] -c <checksum_file>\n  hash_alg:\n    -belt-hash (STB 34.101.31), by default\n    -bash32, -bash64, ..., -bash512 (STB 34.101.77)\n    -bash-prg-hashNNND (STB 34.101.77)\n      with NNN in {256, 384, 512}, D in {1, 2}\n      \\note annonce = NULL\n  \\remark use \"--\" to stop parsing options"
           ,"bsum","hash files using {belt|bash} algorithms");
    return -1;
  }
  bVar1 = false;
  local_4b0 = 0xffffffffffffffff;
LAB_00102b15:
  ppcVar14 = argv + 2;
  lVar18 = 0;
  bVar2 = bVar1;
  do {
    bVar1 = bVar2;
    uVar17 = (uint)lVar18;
    if (argc - 1U == uVar17) goto LAB_00102dd8;
    bVar4 = strStartsWith(argv[lVar18 + 1],"-");
    if (bVar4 == 0) {
      ppcVar14 = ppcVar14 + -1;
      iVar5 = ~uVar17 + argc;
LAB_00102ce4:
      if ((iVar5 < 1) || ((bVar1 && (iVar5 != 1)))) goto LAB_00102dd8;
      hid = 0;
      if (local_4b0 != 0xffffffffffffffff) {
        hid = local_4b0;
      }
      if (!bVar1) {
        uVar13 = hid >> 3;
        if (0x200 < hid) {
          uVar13 = hid / 0x50;
        }
        sVar10 = 0x20;
        if (hid != 0) {
          sVar10 = uVar13;
        }
        iVar12 = 0;
        for (lVar18 = 0; iVar5 != (int)lVar18; lVar18 = lVar18 + 1) {
          iVar7 = bsumHash(hash,hid,ppcVar14[lVar18]);
          iVar11 = -1;
          if (iVar7 == 0) {
            hexFrom(local_438,hash,sVar10);
            hexLower(local_438);
            printf("%s  %s\n",local_438,ppcVar14[lVar18]);
            iVar11 = iVar12;
          }
          iVar12 = iVar11;
        }
        return iVar12;
      }
      pcVar8 = *ppcVar14;
      if (hid == 0) {
        uVar13 = 0x20;
      }
      else if (hid < 0x201) {
        uVar13 = hid >> 3;
      }
      else {
        uVar13 = hid / 0x50;
      }
      file = fileOpen(pcVar8,"rb");
      if (file == (file_t)0x0) {
        pcVar9 = "%s: No such file\n";
        goto LAB_00102fc9;
      }
      lVar18 = 0;
      lVar15 = 0;
      local_490 = 0;
      local_498 = 0;
      goto LAB_00102e88;
    }
    bVar4 = strStartsWith(argv[lVar18 + 1],"-belt-hash");
    if (bVar4 != 0) {
      if (local_4b0 != 0xffffffffffffffff) goto LAB_00102dd8;
      local_4b0 = 0;
      goto LAB_00102c99;
    }
    bVar4 = strStartsWith(argv[lVar18 + 1],"-bash-prg-hash");
    pcVar8 = argv[lVar18 + 1];
    if (bVar4 != 0) {
      sVar10 = strLen("-bash-prg-hash");
      if (local_4b0 != 0xffffffffffffffff) goto LAB_00102dd8;
      pcVar8 = pcVar8 + sVar10;
      bVar4 = decIsValid(pcVar8);
      if ((bVar4 == 0) || (sVar10 = strLen(pcVar8), sVar10 != 4)) goto LAB_00102dd8;
      goto LAB_00102c6c;
    }
    bVar4 = strStartsWith(pcVar8,"-bash");
    pcVar8 = argv[lVar18 + 1];
    if (bVar4 != 0) break;
    iVar5 = strCmp(pcVar8,"-c");
    if (iVar5 != 0) {
      iVar5 = strCmp(argv[lVar18 + 1],"--");
      if (iVar5 == 0) {
        iVar5 = (argc - uVar17) + -2;
        goto LAB_00102ce4;
      }
      goto LAB_00102dd8;
    }
    ppcVar14 = ppcVar14 + 1;
    lVar18 = lVar18 + 1;
    bVar2 = true;
    if (bVar1) goto LAB_00102dd8;
  } while( true );
  sVar10 = strLen("-bash");
  if (local_4b0 != 0xffffffffffffffff) {
LAB_00102dd8:
    __stream = _stderr;
    pcVar8 = errMsg(0x25b);
    fprintf(__stream,"bee2cmd/%s: %s\n","bsum",pcVar8);
    return -1;
  }
  pcVar8 = pcVar8 + sVar10;
  bVar4 = decIsValid(pcVar8);
  if (((bVar4 == 0) || (sVar10 = strLen(pcVar8), sVar10 < 2)) ||
     (sVar10 = strLen(pcVar8), 4 < sVar10)) goto LAB_00102dd8;
LAB_00102c6c:
  sVar10 = decCLZ(pcVar8);
  if (sVar10 != 0) goto LAB_00102dd8;
  uVar6 = decToU32(pcVar8);
  local_4b0 = (ulong)uVar6;
  bVar4 = bsumHidIsValid(local_4b0);
  if (bVar4 == 0) goto LAB_00102dd8;
LAB_00102c99:
  argv = ppcVar14 + -1;
  argc = ~uVar17 + argc;
  goto LAB_00102b15;
LAB_00102e88:
  pcVar9 = fileGets(local_438,0x400,file);
  if (pcVar9 == (char *)0x0) {
    bVar4 = fileClose(file);
    if (bVar4 != 0) {
      if (lVar15 != 0) {
        pcVar8 = "WARNING: %lu input lines (out of %lu) are improperly formatted\n";
        if (lVar15 == 1) {
          pcVar8 = "WARNING: %lu input line (out of %lu) is improperly formatted\n";
        }
        fprintf(_stderr,pcVar8,lVar15,lVar18);
      }
      if (local_490 != 0) {
        pcVar8 = "WARNING: %lu listed files could not be opened or read\n";
        if (local_490 == 1) {
          pcVar8 = "WARNING: %lu listed file could not be opened or read\n";
        }
        fprintf(_stderr,pcVar8,local_490);
      }
      if (local_498 != 0) {
        pcVar8 = "WARNING: %lu computed checksums did not match\n";
        if (local_498 == 1) {
          pcVar8 = "WARNING: %lu computed checksum did not match\n";
        }
        fprintf(_stderr,pcVar8,local_498);
      }
      return -(uint)((local_490 != 0 || lVar15 != 0) || local_498 != 0);
    }
    pcVar9 = "%s: FAILED [close]\n";
LAB_00102fc9:
    printf(pcVar9,pcVar8);
    return -1;
  }
  sVar10 = strLen(local_438);
  if (((sVar10 < uVar13 * 2 + 2) || (local_438[uVar13 * 2] != ' ')) ||
     (local_438[uVar13 * 2 + 1] != ' ')) {
LAB_00102f07:
    lVar15 = lVar15 + 1;
  }
  else {
    local_438[uVar13 * 2] = '\0';
    bVar4 = hexIsValid(local_438);
    if (bVar4 == 0) goto LAB_00102f07;
    oVar3 = hash[sVar10 + 0x3f];
    if (oVar3 == '\n') {
      hash[sVar10 + 0x3f] = '\0';
      oVar3 = hash[sVar10 + 0x3e];
      lVar16 = sVar10 - 2;
    }
    else {
      lVar16 = sVar10 - 1;
    }
    if (oVar3 == '\r') {
      local_438[lVar16] = '\0';
    }
    iVar5 = bsumHash(hash,hid,local_438 + uVar13 * 2 + 2);
    if (iVar5 == -1) {
      local_490 = local_490 + 1;
    }
    else {
      bVar4 = hexEq(hash,local_438);
      if (bVar4 == 0) {
        local_498 = local_498 + 1;
        pcVar9 = "%s: FAILED [checksum]\n";
      }
      else {
        pcVar9 = "%s: OK\n";
      }
      printf(pcVar9,local_438 + uVar13 * 2 + 2);
    }
  }
  lVar18 = lVar18 + 1;
  goto LAB_00102e88;
}

Assistant:

int bsumMain(int argc, char* argv[])
{
	err_t code = ERR_OK;
	size_t hid = SIZE_MAX;
	bool_t check = FALSE;
#ifdef OS_WIN
	setlocale(LC_ALL, "russian_belarus.1251");
#endif
	// справка
	if (argc < 2)
		return bsumUsage();
	// разбор опций
	++argv, --argc;
	while (argc && strStartsWith(argv[0], "-"))
	{
		// belt-hash
		if (strStartsWith(argv[0], "-belt-hash"))
		{
			if (hid != SIZE_MAX)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			hid = 0;
			--argc, ++argv;
		}
		// bash-prg-hash
		else if (strStartsWith(argv[0], "-bash-prg-hash"))
		{
			char* alg_name = argv[0] + strLen("-bash-prg-hash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				strLen(alg_name) != 4 || decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// bash
		else if (strStartsWith(argv[0], "-bash"))
		{
			char* alg_name = argv[0] + strLen("-bash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				2 > strLen(alg_name) || strLen(alg_name) > 4 ||
				decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// check
		else if (strEq(argv[0], "-c"))
		{
			if (check)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			check = TRUE;
			--argc, ++argv;
		}
		// --
		else if (strEq(argv[0], "--"))
		{
			--argc, ++argv;
			break;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	// дополнительные проверки и обработка ошибок
	if (code == ERR_OK && (argc < 1 || check && argc != 1))
		code = ERR_CMD_PARAMS;
	if (code != ERR_OK)
	{
		fprintf(stderr, "bee2cmd/%s: %s\n", _name, errMsg(code));
		return -1;
	}
	// belt-hash по умолчанию
	if (hid == SIZE_MAX)
		hid = 0;
	// вычисление/проверка хэш-значениий
	ASSERT(bsumHidIsValid(hid));
	return check ? bsumCheck(hid, argv[0]) : bsumPrint(hid, argc, argv);
}